

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O1

WebPChunk ** MuxGetChunkListFromId(WebPMux *mux,WebPChunkId id)

{
  long lVar1;
  
  lVar1 = 0x30;
  if (id < WEBP_CHUNK_UNKNOWN) {
    lVar1 = *(long *)(&DAT_0012b998 + (ulong)id * 8);
  }
  return (WebPChunk **)((long)&mux->images_ + lVar1);
}

Assistant:

WebPChunk** MuxGetChunkListFromId(const WebPMux* mux, WebPChunkId id) {
  assert(mux != NULL);
  switch (id) {
    case WEBP_CHUNK_VP8X:    return (WebPChunk**)&mux->vp8x_;
    case WEBP_CHUNK_ICCP:    return (WebPChunk**)&mux->iccp_;
    case WEBP_CHUNK_ANIM:    return (WebPChunk**)&mux->anim_;
    case WEBP_CHUNK_EXIF:    return (WebPChunk**)&mux->exif_;
    case WEBP_CHUNK_XMP:     return (WebPChunk**)&mux->xmp_;
    default:                 return (WebPChunk**)&mux->unknown_;
  }
}